

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O1

FilterPropagateResult __thiscall
duckdb::CheckZonemapTemplated<duckdb::hugeint_t>
          (duckdb *this,BaseStatistics *stats,ExpressionType comparison_type,
          array_ptr<duckdb::Value,_true> constants)

{
  int64_t iVar1;
  FilterPropagateResult FVar2;
  Value *this_00;
  Value *pVVar3;
  undefined7 in_register_00000011;
  hugeint_t min_value;
  hugeint_t max_value;
  array_ptr_iterator<duckdb::Value> __begin2;
  array_ptr_iterator<duckdb::Value> local_70;
  uint64_t local_58;
  int64_t local_50;
  uint64_t local_48;
  hugeint_t local_40;
  
  pVVar3 = constants.ptr;
  local_48 = *(uint64_t *)(this + 0x30);
  local_50 = *(int64_t *)(this + 0x38);
  local_58 = *(uint64_t *)(this + 0x40);
  iVar1 = *(int64_t *)(this + 0x48);
  local_70.index = 0;
  if (pVVar3 != (Value *)0x0) {
    local_70.ptr = (Value *)CONCAT71(in_register_00000011,comparison_type);
    local_70.size = (idx_t)pVVar3;
    do {
      this_00 = array_ptr_iterator<duckdb::Value>::operator*(&local_70);
      local_40 = Value::GetValueUnsafe<duckdb::hugeint_t>(this_00);
      min_value.upper = local_50;
      min_value.lower = local_48;
      max_value.upper = iVar1;
      max_value.lower = local_58;
      FVar2 = CheckZonemapTemplated<duckdb::hugeint_t>
                        ((BaseStatistics *)this,(ExpressionType)stats,min_value,max_value,local_40);
      if (FVar2 < FILTER_ALWAYS_FALSE) {
        return FVar2;
      }
      local_70.index = (idx_t)&((LogicalType *)local_70.index)->physical_type_;
      if (local_70.size <= local_70.index) {
        local_70.index = local_70.size;
      }
    } while (((local_70.ptr != (Value *)CONCAT71(in_register_00000011,comparison_type)) ||
             ((Value *)local_70.index != pVVar3)) || ((Value *)local_70.size != pVVar3));
  }
  return FILTER_ALWAYS_FALSE;
}

Assistant:

hugeint_t GetNumericValueUnion::Operation(const NumericValueUnion &v) {
	return v.value_.hugeint;
}